

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_time.c
# Opt level: O0

guint64 p2sc_cuc2ticks(guint8 *t,int passno)

{
  uint uVar1;
  uint *in_RDI;
  guint32 s;
  guint32 f;
  guint32 in_stack_ffffffffffffffdc;
  guint32 in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  if (in_RDI == (uint *)0x0) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    uVar1 = *in_RDI;
    local_8 = p2sc_cuc2ticks_decoded
                        (uVar1 << 0x18 | (uVar1 & 0xff00) << 8 | (uVar1 & 0xff0000) >> 8 |
                         uVar1 >> 0x18,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  }
  return local_8;
}

Assistant:

guint64 p2sc_cuc2ticks(const guint8 t[SIZEOF_CUC], int passno) {
    if (!t)
        return -1;

    guint32 f = (t[4] << 16) + (t[5] << 8) + t[6];

    guint32 s;
    memcpy(&s, t, sizeof s);
    s = GUINT32_FROM_BE(s);

    return p2sc_cuc2ticks_decoded(passno, s, f);
}